

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformBlockTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::BlockBasicTypeCase::~BlockBasicTypeCase(BlockBasicTypeCase *this)

{
  deqp::gls::UniformBlockCase::~UniformBlockCase(&this->super_UniformBlockCase);
  operator_delete(this,0xb0);
  return;
}

Assistant:

BlockBasicTypeCase (Context& context, const char* name, const char* description, const VarType& type, deUint32 layoutFlags, int numInstances)
		: UniformBlockCase(context.getTestContext(), context.getRenderContext(), name, description, glu::GLSL_VERSION_300_ES, BUFFERMODE_PER_BLOCK)
	{
		UniformBlock& block = m_interface.allocBlock("Block");
		block.addUniform(Uniform("var", type, 0));
		block.setFlags(layoutFlags);

		if (numInstances > 0)
		{
			block.setArraySize(numInstances);
			block.setInstanceName("block");
		}
	}